

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall IteratorTest::accessIteratorOperations<true>(IteratorTest *this)

{
  pointer puVar1;
  pointer puVar2;
  size_t j;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar4;
  reference piVar5;
  logic_error *plVar6;
  code *pcVar7;
  undefined *puVar8;
  long lVar9;
  size_t sVar10;
  Iterator<TestType,_true,_std::allocator<unsigned_long>_> it_3;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  Iterator<TestType,_true,_std::allocator<unsigned_long>_> local_188;
  undefined1 local_158 [8];
  pointer pTStack_150;
  size_t *local_148;
  pointer puStack_140;
  pointer local_138;
  pointer puStack_130;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> local_118;
  undefined1 local_e8 [16];
  size_t *local_d8;
  size_t local_c0;
  size_t local_b8;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_e8._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_158);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
  local_138 = (pointer)0x0;
  puStack_130 = (pointer)0x0;
  local_148 = (size_t *)0x0;
  puStack_140 = (pointer)0x0;
  local_158 = (undefined1  [8])0x0;
  pTStack_150 = (pointer)0x0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
  puVar2 = puStack_130;
  puVar1 = puStack_140;
  local_158 = (undefined1  [8])local_188.view_;
  pTStack_150 = local_188.pointer_;
  local_148 = (size_t *)local_188.index_;
  puStack_140 = local_188.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_138 = local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  puStack_130 = local_188.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
  }
  if (local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar9 = 0;
  do {
    if ((local_158 == (undefined1  [8])0x0) ||
       ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= local_148)) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      pcVar7 = std::runtime_error::~runtime_error;
      puVar8 = &std::runtime_error::typeinfo;
LAB_001be244:
      __cxa_throw(plVar6,puVar8,pcVar7);
    }
    if ((int)pTStack_150->data_ != this->data_[lVar9]) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      pcVar7 = std::logic_error::~logic_error;
      puVar8 = &std::logic_error::typeinfo;
      goto LAB_001be244;
    }
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x18);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
  if (local_158 == (undefined1  [8])0x0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
  }
  else {
    if ((undefined1  [8])local_188.view_ == local_158) {
      if (local_148 != (size_t *)local_188.index_) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        pcVar7 = std::logic_error::~logic_error;
        puVar8 = &std::logic_error::typeinfo;
        goto LAB_001be5cd;
      }
      if (local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                         ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
      if ((pIVar4->view_ == (view_pointer)0x0) ||
         ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
        pcVar7 = std::runtime_error::~runtime_error;
        puVar8 = &std::runtime_error::typeinfo;
LAB_001be5ff:
        __cxa_throw(plVar6,puVar8,pcVar7);
      }
      if (*pIVar4->pointer_ != 0x2e) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        pcVar7 = std::logic_error::~logic_error;
        puVar8 = &std::logic_error::typeinfo;
        goto LAB_001be5ff;
      }
      if (puStack_140 != (pointer)0x0) {
        operator_delete(puStack_140,(long)puStack_130 - (long)puStack_140);
      }
      operator_delete(local_d8,local_c0 * 0x18);
      operator_delete(_Var3._M_current,8);
      _Var3._M_current = (unsigned_long *)operator_new(8);
      *_Var3._M_current = 0x18;
      local_e8._0_8_ = this;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)local_158);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      local_138 = (pointer)0x0;
      puStack_130 = (pointer)0x0;
      local_148 = (size_t *)0x0;
      puStack_140 = (pointer)0x0;
      local_158 = (undefined1  [8])0x0;
      pTStack_150 = (pointer)0x0;
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
      puVar2 = puStack_130;
      puVar1 = puStack_140;
      local_158 = (undefined1  [8])local_188.view_;
      pTStack_150 = local_188.pointer_;
      local_148 = (size_t *)local_188.index_;
      puStack_140 = local_188.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_138 = local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      puStack_130 = local_188.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
      }
      if (local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar9 = 0;
      do {
        if ((local_158 == (undefined1  [8])0x0) ||
           ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= local_148)) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          pcVar7 = std::runtime_error::~runtime_error;
          puVar8 = &std::runtime_error::typeinfo;
LAB_001be276:
          __cxa_throw(plVar6,puVar8,pcVar7);
        }
        if ((int)pTStack_150->data_ != this->data_[lVar9]) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar6,"test failed.");
          pcVar7 = std::logic_error::~logic_error;
          puVar8 = &std::logic_error::typeinfo;
          goto LAB_001be276;
        }
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x18);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
      if (local_158 == (undefined1  [8])0x0) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      }
      else {
        if ((undefined1  [8])local_188.view_ == local_158) {
          if (local_148 != (size_t *)local_188.index_) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"test failed.");
            pcVar7 = std::logic_error::~logic_error;
            puVar8 = &std::logic_error::typeinfo;
            goto LAB_001be67b;
          }
          if (local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                             ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
          if ((pIVar4->view_ == (view_pointer)0x0) ||
             ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
            pcVar7 = std::runtime_error::~runtime_error;
            puVar8 = &std::runtime_error::typeinfo;
LAB_001be6ad:
            __cxa_throw(plVar6,puVar8,pcVar7);
          }
          if (*pIVar4->pointer_ != 0x2e) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"test failed.");
            pcVar7 = std::logic_error::~logic_error;
            puVar8 = &std::logic_error::typeinfo;
            goto LAB_001be6ad;
          }
          if (puStack_140 != (pointer)0x0) {
            operator_delete(puStack_140,(long)puStack_130 - (long)puStack_140);
          }
          operator_delete(local_d8,local_c0 * 0x18);
          operator_delete(_Var3._M_current,8);
          _Var3._M_current = (unsigned_long *)operator_new(8);
          *_Var3._M_current = 0x18;
          local_e8._0_8_ = this;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)local_158);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          local_138 = (pointer)0x0;
          puStack_130 = (pointer)0x0;
          local_148 = (size_t *)0x0;
          puStack_140 = (pointer)0x0;
          local_158 = (undefined1  [8])0x0;
          pTStack_150 = (pointer)0x0;
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_118,
                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
          local_188.view_ = (view_pointer)local_118.view_;
          local_188.pointer_ = local_118.pointer_;
          local_188.index_ = local_118.index_;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_188.coordinates_,&local_118.coordinates_);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188);
          puVar2 = puStack_130;
          puVar1 = puStack_140;
          local_158 = (undefined1  [8])local_188.view_;
          pTStack_150 = local_188.pointer_;
          local_148 = (size_t *)local_188.index_;
          puStack_140 = local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_138 = local_188.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          puStack_130 = local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
          local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_188.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1,(long)puVar2 - (long)puVar1);
          }
          if (local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_118.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar9 = 0;
          do {
            if ((local_158 == (undefined1  [8])0x0) ||
               ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= local_148)) {
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              pcVar7 = std::runtime_error::~runtime_error;
              puVar8 = &std::runtime_error::typeinfo;
LAB_001be2a8:
              __cxa_throw(plVar6,puVar8,pcVar7);
            }
            if ((int)pTStack_150->data_ != this->data_[lVar9]) {
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar6,"test failed.");
              pcVar7 = std::logic_error::~logic_error;
              puVar8 = &std::logic_error::typeinfo;
              goto LAB_001be2a8;
            }
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x18);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_188,
                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
          if (local_158 == (undefined1  [8])0x0) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          }
          else {
            if ((undefined1  [8])local_188.view_ == local_158) {
              if (local_148 != (size_t *)local_188.index_) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar6,"test failed.");
                pcVar7 = std::logic_error::~logic_error;
                puVar8 = &std::logic_error::typeinfo;
                goto LAB_001be729;
              }
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
              if ((pIVar4->view_ == (view_pointer)0x0) ||
                 ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                pcVar7 = std::runtime_error::~runtime_error;
                puVar8 = &std::runtime_error::typeinfo;
LAB_001be75b:
                __cxa_throw(plVar6,puVar8,pcVar7);
              }
              if (*pIVar4->pointer_ != 0x2e) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar6,"test failed.");
                pcVar7 = std::logic_error::~logic_error;
                puVar8 = &std::logic_error::typeinfo;
                goto LAB_001be75b;
              }
              if (puStack_140 != (pointer)0x0) {
                operator_delete(puStack_140,(long)puStack_130 - (long)puStack_140);
              }
              operator_delete(local_d8,local_c0 * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar9 = 0;
              do {
                *(long *)(local_e8 + lVar9 * 8) = lVar9;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_158 = (undefined1  [8])local_e8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)&pTStack_150,_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_188);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::Iterator
                        (&local_188,
                         (View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158,0);
              sVar10 = 0;
              do {
                if ((local_188.view_ == (view_pointer)0x0) ||
                   ((size_t *)((local_188.view_)->geometry_).size_ <= local_188.index_)) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001be2da:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
                if (sVar10 != (local_188.pointer_)->data_) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001be2da;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          (&local_188);
                sVar10 = sVar10 + 1;
              } while (sVar10 != 0x18);
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_148,(long)puStack_130 * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar9 = 0;
              do {
                *(long *)(local_e8 + lVar9 * 8) = lVar9;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_158 = (undefined1  [8])local_e8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)&pTStack_150,_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_188);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::Iterator
                        (&local_188,
                         (View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158,0);
              sVar10 = 0;
              do {
                if ((local_188.view_ == (view_pointer)0x0) ||
                   ((size_t *)((local_188.view_)->geometry_).size_ <= local_188.index_)) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001be30c:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
                if (sVar10 != (local_188.pointer_)->data_) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001be30c;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          (&local_188);
                sVar10 = sVar10 + 1;
              } while (sVar10 != 0x18);
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_148,(long)puStack_130 * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar9 = 0;
              do {
                *(long *)(local_e8 + lVar9 * 8) = lVar9;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_158 = (undefined1  [8])local_e8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)&pTStack_150,_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_188);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_118,
                         (View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158,0);
              local_188.view_ = (view_pointer)local_118.view_;
              local_188.pointer_ = local_118.pointer_;
              local_188.index_ = local_118.index_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_188.coordinates_,&local_118.coordinates_);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        (&local_188);
              if (local_118.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              sVar10 = 0;
              do {
                if ((local_188.view_ == (view_pointer)0x0) ||
                   ((size_t *)((local_188.view_)->geometry_).size_ <= local_188.index_)) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001be33e:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
                if (sVar10 != (local_188.pointer_)->data_) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001be33e;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          (&local_188);
                sVar10 = sVar10 + 1;
              } while (sVar10 != 0x18);
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_148,(long)puStack_130 * 0x18);
              operator_delete(_Var3._M_current,8);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_e8._0_8_ = this;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_158);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
              local_138 = (pointer)0x0;
              puStack_130 = (pointer)0x0;
              local_148 = (size_t *)0x0;
              puStack_140 = (pointer)0x0;
              local_158 = (undefined1  [8])0x0;
              pTStack_150 = (pointer)0x0;
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188,
                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
              puVar2 = puStack_130;
              puVar1 = puStack_140;
              local_158 = (undefined1  [8])local_188.view_;
              pTStack_150 = local_188.pointer_;
              local_148 = (size_t *)local_188.index_;
              puStack_140 = local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              local_138 = local_188.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              puStack_130 = local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_188.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar1 != (pointer)0x0) {
                operator_delete(puVar1,(long)puVar2 - (long)puVar1);
              }
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar9 = 0;
              do {
                if ((local_158 == (undefined1  [8])0x0) ||
                   (((geometry_type *)((long)local_158 + 8))->size_ <=
                    (ulong)((long)local_148 + lVar9))) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar8 = &std::runtime_error::typeinfo;
LAB_001be370:
                  __cxa_throw(plVar6,puVar8,pcVar7);
                }
                piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                   ((View<int,_true,_std::allocator<unsigned_long>_> *)local_158,
                                    (long)local_148 + lVar9);
                if (*piVar5 != this->data_[lVar9]) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001be370;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x18);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188,
                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
              if (local_158 == (undefined1  [8])0x0) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              }
              else {
                if ((undefined1  [8])local_188.view_ == local_158) {
                  if (local_148 == (size_t *)local_188.index_) {
                    if (((geometry_type *)((long)local_158 + 8))->size_ <= (long)local_148 + 4U) {
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.")
                      ;
                      goto LAB_001be7bb;
                    }
                    piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_158
                                        ,(long)local_148 + 4U);
                    if (*piVar5 == this->data_[4]) {
                      if ((local_158 == (undefined1  [8])0x0) ||
                         ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= local_148 + 2
                         )) {
                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar6,"Assertion failed.");
                        goto LAB_001be7bb;
                      }
                      piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                         ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                          local_158,(size_t)(local_148 + 2));
                      if (*piVar5 == this->data_[0x10]) {
                        if (local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_188.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (puStack_140 != (pointer)0x0) {
                          operator_delete(puStack_140,(long)puStack_130 - (long)puStack_140);
                        }
                        operator_delete(local_d8,local_c0 * 0x18);
                        operator_delete(_Var3._M_current,8);
                        _Var3._M_current = (unsigned_long *)operator_new(8);
                        *_Var3._M_current = 0x18;
                        local_e8._0_8_ = this;
                        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                  ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),_Var3,
                                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    )(_Var3._M_current + 1),&andres::defaultOrder,
                                   &andres::defaultOrder,(allocator_type *)local_158);
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        local_138 = (pointer)0x0;
                        puStack_130 = (pointer)0x0;
                        local_148 = (size_t *)0x0;
                        puStack_140 = (pointer)0x0;
                        local_158 = (undefined1  [8])0x0;
                        pTStack_150 = (pointer)0x0;
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158)
                        ;
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188
                                   ,(View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
                        puVar2 = puStack_130;
                        puVar1 = puStack_140;
                        local_158 = (undefined1  [8])local_188.view_;
                        pTStack_150 = local_188.pointer_;
                        local_148 = (size_t *)local_188.index_;
                        puStack_140 = local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                        local_138 = local_188.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                        puStack_130 = local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)0x0;
                        local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_188.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        if (puVar1 != (pointer)0x0) {
                          operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                        }
                        if (local_188.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_188.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        lVar9 = 0;
                        do {
                          if ((local_158 == (undefined1  [8])0x0) ||
                             (((geometry_type *)((long)local_158 + 8))->size_ <=
                              (ulong)((long)local_148 + lVar9))) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar6,"Assertion failed.");
                            pcVar7 = std::runtime_error::~runtime_error;
                            puVar8 = &std::runtime_error::typeinfo;
LAB_001be3a2:
                            __cxa_throw(plVar6,puVar8,pcVar7);
                          }
                          piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                   operator()((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_158,(long)local_148 + lVar9);
                          if (*piVar5 != this->data_[lVar9]) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar6,"test failed.");
                            pcVar7 = std::logic_error::~logic_error;
                            puVar8 = &std::logic_error::typeinfo;
                            goto LAB_001be3a2;
                          }
                          lVar9 = lVar9 + 1;
                        } while (lVar9 != 0x18);
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_188
                                   ,(View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
                        if (local_158 == (undefined1  [8])0x0) {
                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar6,"Assertion failed.");
                        }
                        else {
                          if ((undefined1  [8])local_188.view_ == local_158) {
                            if (local_148 == (size_t *)local_188.index_) {
                              if (((geometry_type *)((long)local_158 + 8))->size_ <=
                                  (long)local_148 + 4U) {
                                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar6,"Assertion failed.");
                                goto LAB_001be829;
                              }
                              piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                       operator()((View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_158,(long)local_148 + 4U);
                              if (*piVar5 == this->data_[4]) {
                                if ((local_158 == (undefined1  [8])0x0) ||
                                   ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <=
                                    local_148 + 2)) {
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar6,"Assertion failed.");
                                  goto LAB_001be829;
                                }
                                piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                         operator()((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_158,(size_t)(local_148 + 2));
                                if (*piVar5 == this->data_[0x10]) {
                                  if (local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_188.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (puStack_140 != (pointer)0x0) {
                                    operator_delete(puStack_140,
                                                    (long)puStack_130 - (long)puStack_140);
                                  }
                                  operator_delete(local_d8,local_c0 * 0x18);
                                  operator_delete(_Var3._M_current,8);
                                  _Var3._M_current = (unsigned_long *)operator_new(8);
                                  *_Var3._M_current = 0x18;
                                  local_e8._0_8_ = this;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_e8 + 8),_Var3,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(_Var3._M_current + 1),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)local_158);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  local_138 = (pointer)0x0;
                                  puStack_130 = (pointer)0x0;
                                  local_148 = (size_t *)0x0;
                                  puStack_140 = (pointer)0x0;
                                  local_158 = (undefined1  [8])0x0;
                                  pTStack_150 = (pointer)0x0;
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 *)local_158);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                           &local_118,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_e8,0);
                                  local_188.view_ = (view_pointer)local_118.view_;
                                  local_188.pointer_ = local_118.pointer_;
                                  local_188.index_ = local_118.index_;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            (&local_188.coordinates_,&local_118.coordinates_);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 *)&local_188);
                                  puVar2 = puStack_130;
                                  puVar1 = puStack_140;
                                  local_158 = (undefined1  [8])local_188.view_;
                                  pTStack_150 = local_188.pointer_;
                                  local_148 = (size_t *)local_188.index_;
                                  puStack_140 = local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start;
                                  local_138 = local_188.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_finish;
                                  puStack_130 = local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                  local_188.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                  if (puVar1 != (pointer)0x0) {
                                    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                  }
                                  if (local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_188.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_118.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_118.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_118.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  lVar9 = 0;
                                  do {
                                    if ((local_158 == (undefined1  [8])0x0) ||
                                       (((geometry_type *)((long)local_158 + 8))->size_ <=
                                        (ulong)((long)local_148 + lVar9))) {
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar6,"Assertion failed.");
                                      pcVar7 = std::runtime_error::~runtime_error;
                                      puVar8 = &std::runtime_error::typeinfo;
LAB_001be3d4:
                                      __cxa_throw(plVar6,puVar8,pcVar7);
                                    }
                                    piVar5 = andres::View<int,_true,_std::allocator<unsigned_long>_>
                                             ::operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(long)local_148 + lVar9);
                                    if (*piVar5 != this->data_[lVar9]) {
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar6,"test failed.");
                                      pcVar7 = std::logic_error::~logic_error;
                                      puVar8 = &std::logic_error::typeinfo;
                                      goto LAB_001be3d4;
                                    }
                                    lVar9 = lVar9 + 1;
                                  } while (lVar9 != 0x18);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                           &local_188,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_e8,0);
                                  if (local_158 == (undefined1  [8])0x0) {
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar6,"Assertion failed.");
                                  }
                                  else {
                                    if ((undefined1  [8])local_188.view_ == local_158) {
                                      if (local_148 == (size_t *)local_188.index_) {
                                        if (((geometry_type *)((long)local_158 + 8))->size_ <=
                                            (long)local_148 + 4U) {
                                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar6,"Assertion failed.");
                                          goto LAB_001be897;
                                        }
                                        piVar5 = andres::
                                                 View<int,_true,_std::allocator<unsigned_long>_>::
                                                 operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(long)local_148 + 4U);
                                        if (*piVar5 == this->data_[4]) {
                                          if ((local_158 == (undefined1  [8])0x0) ||
                                             ((size_t *)
                                              ((geometry_type *)((long)local_158 + 8))->size_ <=
                                              local_148 + 2)) {
                                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar6,"Assertion failed.");
                                            goto LAB_001be897;
                                          }
                                          piVar5 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(size_t)(local_148 + 2));
                                          if (*piVar5 == this->data_[0x10]) {
                                            if (local_188.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_188.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            if (puStack_140 != (pointer)0x0) {
                                              operator_delete(puStack_140,
                                                              (long)puStack_130 - (long)puStack_140)
                                              ;
                                            }
                                            operator_delete(local_d8,local_c0 * 0x18);
                                            operator_delete(_Var3._M_current,8);
                                            return;
                                          }
                                        }
                                      }
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar6,"test failed.");
                                      pcVar7 = std::logic_error::~logic_error;
                                      puVar8 = &std::logic_error::typeinfo;
                                      goto LAB_001be8a5;
                                    }
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar6,"Assertion failed.");
                                  }
LAB_001be897:
                                  pcVar7 = std::runtime_error::~runtime_error;
                                  puVar8 = &std::runtime_error::typeinfo;
LAB_001be8a5:
                                  __cxa_throw(plVar6,puVar8,pcVar7);
                                }
                              }
                            }
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar6,"test failed.");
                            pcVar7 = std::logic_error::~logic_error;
                            puVar8 = &std::logic_error::typeinfo;
                            goto LAB_001be837;
                          }
                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar6,"Assertion failed.");
                        }
LAB_001be829:
                        pcVar7 = std::runtime_error::~runtime_error;
                        puVar8 = &std::runtime_error::typeinfo;
LAB_001be837:
                        __cxa_throw(plVar6,puVar8,pcVar7);
                      }
                    }
                  }
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar8 = &std::logic_error::typeinfo;
                  goto LAB_001be7c9;
                }
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              }
LAB_001be7bb:
              pcVar7 = std::runtime_error::~runtime_error;
              puVar8 = &std::runtime_error::typeinfo;
LAB_001be7c9:
              __cxa_throw(plVar6,puVar8,pcVar7);
            }
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          }
          pcVar7 = std::runtime_error::~runtime_error;
          puVar8 = &std::runtime_error::typeinfo;
LAB_001be729:
          __cxa_throw(plVar6,puVar8,pcVar7);
        }
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      }
      pcVar7 = std::runtime_error::~runtime_error;
      puVar8 = &std::runtime_error::typeinfo;
LAB_001be67b:
      __cxa_throw(plVar6,puVar8,pcVar7);
    }
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
  }
  pcVar7 = std::runtime_error::~runtime_error;
  puVar8 = &std::runtime_error::typeinfo;
LAB_001be5cd:
  __cxa_throw(plVar6,puVar8,pcVar7);
}

Assistant:

void IteratorTest::accessIteratorOperations() {
    // operator*
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator->
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, constTarget> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, constTarget> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<TestType, true> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, false> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    // operator[]
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
}